

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# millerrabin.c
# Opt level: O0

uint miller_rabin_checks_needed(uint bits)

{
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  uint bits_local;
  
  if (bits < 0x514) {
    if (bits < 0x352) {
      if (bits < 0x28a) {
        if (bits < 0x226) {
          if (bits < 0x1c2) {
            if (bits < 400) {
              if (bits < 0x15e) {
                if (bits < 300) {
                  if (bits < 0xfa) {
                    if (bits < 200) {
                      local_34 = 0x1b;
                      if (0x95 < bits) {
                        local_34 = 0x12;
                      }
                    }
                    else {
                      local_34 = 0xf;
                    }
                    local_30 = local_34;
                  }
                  else {
                    local_30 = 0xc;
                  }
                  local_2c = local_30;
                }
                else {
                  local_2c = 9;
                }
                local_28 = local_2c;
              }
              else {
                local_28 = 8;
              }
              local_24 = local_28;
            }
            else {
              local_24 = 7;
            }
            local_20 = local_24;
          }
          else {
            local_20 = 6;
          }
          local_1c = local_20;
        }
        else {
          local_1c = 5;
        }
        local_18 = local_1c;
      }
      else {
        local_18 = 4;
      }
      local_14 = local_18;
    }
    else {
      local_14 = 3;
    }
    local_10 = local_14;
  }
  else {
    local_10 = 2;
  }
  return local_10;
}

Assistant:

unsigned miller_rabin_checks_needed(unsigned bits)
{
    /* Table 4.4 from Handbook of Applied Cryptography */
    return (bits >= 1300 ?  2 : bits >= 850 ?  3 : bits >= 650 ?  4 :
            bits >=  550 ?  5 : bits >= 450 ?  6 : bits >= 400 ?  7 :
            bits >=  350 ?  8 : bits >= 300 ?  9 : bits >= 250 ? 12 :
            bits >=  200 ? 15 : bits >= 150 ? 18 : 27);
}